

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O2

uint __thiscall FRandom::GenRand32(FRandom *this)

{
  int iVar1;
  
  if (this->initialized != false) {
    iVar1 = this->idx;
    if (0x13 < iVar1) {
      GenRandAll(this);
      iVar1 = 0;
    }
    this->idx = iVar1 + 1;
    return *(uint *)((long)&this->sfmt + (long)iVar1 * 4);
  }
  __assert_fail("initialized",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sfmt/SFMT.cpp"
                ,0x16d,"unsigned int FRandom::GenRand32()");
}

Assistant:

unsigned int FRandom::GenRand32()
{
	DWORD r;

	assert(initialized);
	if (idx >= SFMT::N32)
	{
		GenRandAll();
		idx = 0;
	}
	r = sfmt.u[idx++];
	return r;
}